

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hostref.c
# Opt level: O0

wasm_ref_t * call_r_r(wasm_func_t *func,wasm_ref_t *ref)

{
  long lVar1;
  undefined8 local_58;
  wasm_val_vec_t results;
  wasm_val_vec_t args;
  wasm_val_t rs [1];
  wasm_val_t vs [1];
  wasm_ref_t *ref_local;
  wasm_func_t *func_local;
  
  printf("call_r_r... ");
  fflush(_stdout);
  rs[0].of.i32._0_1_ = 0x80;
  args.data = (wasm_val_t *)0x80;
  rs[0].kind = '\0';
  rs[0]._1_7_ = 0;
  results.data = (wasm_val_t *)0x1;
  args.size = (size_t)&rs[0].of;
  local_58 = 1;
  results.size = (size_t)&args.data;
  lVar1 = wasm_func_call(func,&results.data,&local_58);
  if (lVar1 != 0) {
    printf("> Error calling function!\n");
    exit(1);
  }
  printf("okay\n");
  return (wasm_ref_t *)rs[0]._0_8_;
}

Assistant:

own wasm_ref_t* call_r_r(const wasm_func_t* func, wasm_ref_t* ref) {
  printf("call_r_r... "); fflush(stdout);
  wasm_val_t vs[1] = { WASM_REF_VAL(ref) };
  wasm_val_t rs[1] = { WASM_INIT_VAL };
  wasm_val_vec_t args = WASM_ARRAY_VEC(vs);
  wasm_val_vec_t results = WASM_ARRAY_VEC(rs);
  if (wasm_func_call(func, &args, &results)) {
    printf("> Error calling function!\n");
    exit(1);
  }
  printf("okay\n");
  return rs[0].of.ref;
}